

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt_n.hpp
# Opt level: O3

void __thiscall
dna_bwt_n<dna_string_n>::dna_bwt_n(dna_bwt_n<dna_string_n> *this,string *path,char TERM)

{
  dna_string_n *this_00;
  pointer pcVar1;
  pointer puVar2;
  pointer ppVar3;
  char cVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  string local_d0;
  dna_string_n local_b0;
  string local_50;
  
  this_00 = &this->BWT;
  this->F_N = 0;
  this->F_T = 0;
  this->F_C = 0;
  this->F_G = 0;
  this->n = 0;
  this->F_A = 0;
  (this->BWT).TERM = '#';
  (this->BWT).n_superblocks = 0;
  (this->BWT).n_blocks = 0;
  (this->BWT).memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->BWT).memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->BWT).memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->BWT).data = (uint8_t *)0x0;
  (this->BWT).superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->BWT).superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->BWT).superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->BWT).nbytes = 0;
  (this->BWT).n = 0;
  this->TERM = TERM;
  pcVar1 = (path->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + path->_M_string_length);
  uVar5 = filesize(&local_50);
  this->n = uVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar1 = (path->_M_dataplus)._M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + path->_M_string_length);
  dna_string_n::dna_string_n(&local_b0,&local_d0,TERM);
  (this->BWT).n_blocks = local_b0.n_blocks;
  this_00->TERM = local_b0.TERM;
  *(undefined7 *)&this_00->field_0x1 = local_b0._1_7_;
  (this->BWT).n_superblocks = local_b0.n_superblocks;
  puVar2 = (this->BWT).memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->BWT).memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b0.memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->BWT).memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b0.memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->BWT).memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b0.memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_b0.memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  ppVar3 = (this->BWT).superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->BWT).data = local_b0.data;
  (this->BWT).superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b0.superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->BWT).superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b0.superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->BWT).superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b0.superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_b0.superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppVar3 == (pointer)0x0) {
    (this->BWT).nbytes = local_b0.nbytes;
    (this->BWT).n = local_b0.n;
  }
  else {
    operator_delete(ppVar3);
    (this->BWT).nbytes = local_b0.nbytes;
    (this->BWT).n = local_b0.n;
    if (local_b0.superblock_ranks.super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.superblock_ranks.
                      super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_b0.memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.memory.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (this->n == 0) {
    uVar5 = this->F_T;
  }
  else {
    uVar6 = 0;
    do {
      cVar4 = dna_string_n::operator[](this_00,uVar6);
      this->F_A = this->F_A + (ulong)(cVar4 == TERM);
      cVar4 = dna_string_n::operator[](this_00,uVar6);
      this->F_C = this->F_C + (ulong)(cVar4 == 'A');
      cVar4 = dna_string_n::operator[](this_00,uVar6);
      this->F_G = this->F_G + (ulong)(cVar4 == 'C');
      cVar4 = dna_string_n::operator[](this_00,uVar6);
      this->F_N = this->F_N + (ulong)(cVar4 == 'G');
      cVar4 = dna_string_n::operator[](this_00,uVar6);
      uVar5 = (ulong)(cVar4 == 'N') + this->F_T;
      this->F_T = uVar5;
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->n);
  }
  uVar6 = this->F_C + this->F_A;
  this->F_C = uVar6;
  uVar6 = uVar6 + this->F_G;
  this->F_G = uVar6;
  uVar6 = uVar6 + this->F_N;
  this->F_N = uVar6;
  this->F_T = uVar6 + uVar5;
  return;
}

Assistant:

dna_bwt_n(string path, char TERM = '#'){

		this->TERM = TERM;

		n = uint64_t(filesize(path));

		BWT = str_type(path, TERM);

		uint64_t n_term = 0;

		//build F column
		for(uint64_t i=0;i<n;++i){

			assert(BWT[i] < 256);

			F_A += (BWT[i]==TERM);
			F_C += (BWT[i]=='A');
			F_G += (BWT[i]=='C');
			F_N += (BWT[i]=='G');
			F_T += (BWT[i]=='N');

		}

		F_C += F_A;
		F_G += F_C;
		F_N += F_G;
		F_T += F_N;

	}